

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::Configure(cmMakefile *this)

{
  bool bVar1;
  char *pcVar2;
  reference ppcVar3;
  __normal_iterator<cmMakefile_**,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>
  local_190;
  __normal_iterator<cmMakefile_**,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>
  local_188;
  iterator sdi;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> subdirs;
  undefined1 local_160 [8];
  cmParseFileScope pfs;
  cmListFile listFile;
  string local_110;
  allocator local_e9;
  Directory local_e8;
  undefined1 local_c0 [8];
  string currentStart;
  Directory local_90;
  string local_68 [8];
  string filesDir;
  BuildsystemFileScope scope;
  cmMakefile *this_local;
  
  BuildsystemFileScope::BuildsystemFileScope
            ((BuildsystemFileScope *)((long)&filesDir.field_2 + 8),this);
  cmState::Snapshot::GetDirectory(&local_90,&this->StateSnapshot);
  pcVar2 = cmState::Directory::GetCurrentBinary(&local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_68,pcVar2,(allocator *)(currentStart.field_2._M_local_buf + 0xb));
  std::allocator<char>::~allocator((allocator<char> *)(currentStart.field_2._M_local_buf + 0xb));
  pcVar2 = cmake::GetCMakeFilesDirectory();
  std::__cxx11::string::operator+=(local_68,pcVar2);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cmsys::SystemTools::MakeDirectory(pcVar2);
  cmState::Snapshot::GetDirectory(&local_e8,&this->StateSnapshot);
  pcVar2 = cmState::Directory::GetCurrentSource(&local_e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_c0,pcVar2,&local_e9);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  std::__cxx11::string::operator+=((string *)local_c0,"/CMakeLists.txt");
  pcVar2 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmsys::SystemTools::FileExists(pcVar2,true);
  if (!bVar1) {
    __assert_fail("cmSystemTools::FileExists(currentStart.c_str(), true)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmMakefile.cxx"
                  ,0x676,"void cmMakefile::Configure()");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_110,"CMAKE_PARENT_LIST_FILE",
             (allocator *)
             ((long)&listFile.Functions.
                     super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pcVar2 = (char *)std::__cxx11::string::c_str();
  AddDefinition(this,&local_110,pcVar2);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&listFile.Functions.
                     super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cmListFile::cmListFile((cmListFile *)&pfs.Context.Line);
  cmParseFileScope::cmParseFileScope((cmParseFileScope *)local_160,this);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  bVar1 = IsRootMakefile(this);
  bVar1 = cmListFile::ParseFile((cmListFile *)&pfs.Context.Line,pcVar2,bVar1,this);
  cmParseFileScope::~cmParseFileScope((cmParseFileScope *)local_160);
  if (bVar1) {
    ReadListFile(this,(cmListFile *)&pfs.Context.Line,(string *)local_c0);
    bVar1 = cmSystemTools::GetFatalErrorOccured();
    if (bVar1) {
      BuildsystemFileScope::Quiet((BuildsystemFileScope *)((long)&filesDir.field_2 + 8));
    }
    std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::vector
              ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)&sdi,
               &this->UnConfiguredDirectories);
    local_188._M_current =
         (cmMakefile **)
         std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::begin
                   ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)&sdi);
    while( true ) {
      local_190._M_current =
           (cmMakefile **)
           std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::end
                     ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)&sdi);
      bVar1 = __gnu_cxx::operator!=(&local_188,&local_190);
      if (!bVar1) break;
      ppcVar3 = __gnu_cxx::
                __normal_iterator<cmMakefile_**,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>
                ::operator*(&local_188);
      cmState::Snapshot::InitializeFromParent_ForSubdirsCommand(&(*ppcVar3)->StateSnapshot);
      ppcVar3 = __gnu_cxx::
                __normal_iterator<cmMakefile_**,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>
                ::operator*(&local_188);
      ConfigureSubDirectory(this,*ppcVar3);
      __gnu_cxx::
      __normal_iterator<cmMakefile_**,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>::
      operator++(&local_188);
    }
    AddCMakeDependFilesFromUser(this);
    std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::~vector
              ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)&sdi);
  }
  cmListFile::~cmListFile((cmListFile *)&pfs.Context.Line);
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::~string(local_68);
  BuildsystemFileScope::~BuildsystemFileScope((BuildsystemFileScope *)((long)&filesDir.field_2 + 8))
  ;
  return;
}

Assistant:

void cmMakefile::Configure()
{
  BuildsystemFileScope scope(this);

  // make sure the CMakeFiles dir is there
  std::string filesDir = this->StateSnapshot.GetDirectory().GetCurrentBinary();
  filesDir += cmake::GetCMakeFilesDirectory();
  cmSystemTools::MakeDirectory(filesDir.c_str());

  std::string currentStart =
      this->StateSnapshot.GetDirectory().GetCurrentSource();
  currentStart += "/CMakeLists.txt";
  assert(cmSystemTools::FileExists(currentStart.c_str(), true));
  this->AddDefinition("CMAKE_PARENT_LIST_FILE", currentStart.c_str());

  cmListFile listFile;
  {
  cmParseFileScope pfs(this);
  if (!listFile.ParseFile(currentStart.c_str(), this->IsRootMakefile(), this))
    {
    return;
    }
  }
  this->ReadListFile(listFile, currentStart);
  if(cmSystemTools::GetFatalErrorOccured())
    {
    scope.Quiet();
    }

   // at the end handle any old style subdirs
  std::vector<cmMakefile*> subdirs = this->UnConfiguredDirectories;

  // for each subdir recurse
  std::vector<cmMakefile*>::iterator sdi = subdirs.begin();
  for (; sdi != subdirs.end(); ++sdi)
    {
    (*sdi)->StateSnapshot.InitializeFromParent_ForSubdirsCommand();
    this->ConfigureSubDirectory(*sdi);
    }

  this->AddCMakeDependFilesFromUser();
}